

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  if (0x10 < this->limit_) {
    pcVar2 = NextBuffer<false>(this,0,-1);
    pcVar1 = this->buffer_end_;
    if (pcVar2 == (char *)0x0) {
      this->limit_end_ = pcVar1;
      this->last_tag_minus_1_ = 1;
      pcVar2 = (char *)0x0;
    }
    else {
      uVar3 = ((int)pcVar2 - (int)pcVar1) + this->limit_;
      this->limit_ = uVar3;
      this->limit_end_ = pcVar1 + (int)((int)uVar3 >> 0x1f & uVar3);
    }
    return pcVar2;
  }
  Next((EpsCopyInputStream *)&stack0xffffffffffffffe8);
}

Assistant:

const char* EpsCopyInputStream::Next() {
  ABSL_DCHECK(limit_ > kSlopBytes);
  auto p = NextBuffer</*kExperimentalV2=*/false>(0 /* immaterial */, -1);
  if (p == nullptr) {
    limit_end_ = buffer_end_;
    // Distinguish ending on a pushed limit or ending on end-of-stream.
    SetEndOfStream();
    return nullptr;
  }
  limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return p;
}